

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quuid.cpp
# Opt level: O2

QDataStream * operator>>(QDataStream *s,QUuid *id)

{
  undefined1 *puVar1;
  int i;
  qint64 qVar2;
  long lVar3;
  storage_type *extraout_RDX;
  long in_FS_OFFSET;
  QByteArrayView bytes;
  QUuid QVar4;
  undefined8 local_28;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  qVar2 = QDataStream::readRawData(s,(char *)&local_28,0x10);
  puVar1 = local_28;
  if (qVar2 == 0x10) {
    if (s->noswap == false) {
      bytes.m_data = extraout_RDX;
      bytes.m_size = (qsizetype)&local_28;
      QVar4 = QUuid::fromRfc4122((QUuid *)0x10,bytes);
      *id = QVar4;
    }
    else {
      id->data1 = (uint)local_28;
      id->data2 = local_28._4_2_;
      id->data3 = local_28._6_2_;
      for (lVar3 = 0; local_28 = puVar1, lVar3 != 8; lVar3 = lVar3 + 1) {
        id->data4[lVar3] = *(uchar *)((long)&puStack_20 + lVar3);
      }
    }
  }
  else {
    QDataStream::setStatus(s,ReadPastEnd);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return s;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &s, QUuid &id)
{
    std::array<char, 16> bytes;
    if (s.readRawData(bytes.data(), 16) != 16) {
        s.setStatus(QDataStream::ReadPastEnd);
        return s;
    }

    if (s.byteOrder() == QDataStream::BigEndian) {
        id = QUuid::fromRfc4122(bytes);
    } else {
        const uchar *data = reinterpret_cast<const uchar *>(bytes.data());

        id.data1 = qFromLittleEndian<quint32>(data);
        data += sizeof(quint32);
        id.data2 = qFromLittleEndian<quint16>(data);
        data += sizeof(quint16);
        id.data3 = qFromLittleEndian<quint16>(data);
        data += sizeof(quint16);

        for (int i = 0; i < 8; ++i) {
            id.data4[i] = *(data);
            data++;
        }
    }

    return s;
}